

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio.c
# Opt level: O1

mraa_result_t mraa_gpio_edge_mode(mraa_gpio_context dev,mraa_gpio_edge_t mode)

{
  uint uVar1;
  _func_mraa_result_t_mraa_gpio_context_mraa_gpio_edge_t *UNRECOVERED_JUMPTABLE;
  mraa_result_t mVar2;
  int __fd;
  mraa_gpio_events_t pmVar3;
  int *piVar4;
  char *pcVar5;
  size_t sVar6;
  size_t __size;
  char bu [64];
  char filepath [64];
  char local_78 [72];
  
  if (dev == (mraa_gpio_context)0x0) {
    syslog(3,"gpio: edge_mode: context is invalid");
    mVar2 = MRAA_ERROR_INVALID_HANDLE;
  }
  else {
    if ((dev->advance_func != (mraa_adv_func_t *)0x0) &&
       (UNRECOVERED_JUMPTABLE = dev->advance_func->gpio_edge_mode_replace,
       UNRECOVERED_JUMPTABLE != (_func_mraa_result_t_mraa_gpio_context_mraa_gpio_edge_t *)0x0)) {
      mVar2 = (*UNRECOVERED_JUMPTABLE)(dev,mode);
      return mVar2;
    }
    if ((mode != MRAA_GPIO_EDGE_NONE) && (dev->events == (mraa_gpio_events_t)0x0)) {
      uVar1 = dev->num_pins;
      __size = (ulong)uVar1 << 4;
      pmVar3 = (mraa_gpio_events_t)malloc(__size);
      dev->events = pmVar3;
      if (pmVar3 == (mraa_gpio_events_t)0x0) {
        syslog(3,"mraa_gpio_edge_mode() malloc error");
        return MRAA_ERROR_NO_RESOURCES;
      }
      if ((ulong)uVar1 != 0) {
        sVar6 = 0;
        do {
          *(undefined4 *)((long)&pmVar3->id + sVar6) = 0xffffffff;
          sVar6 = sVar6 + 0x10;
        } while (__size != sVar6);
      }
    }
    if (plat->chardev_capable != 0) {
      mVar2 = mraa_gpio_chardev_edge_mode(dev,mode);
      return mVar2;
    }
    if (dev == (mraa_gpio_context)0x0) {
      mVar2 = MRAA_SUCCESS;
    }
    else {
      if (dev->value_fp != -1) {
        close(dev->value_fp);
        dev->value_fp = -1;
      }
      snprintf(local_78,0x40,"/sys/class/gpio/gpio%d/edge",(ulong)(uint)dev->pin);
      __fd = open(local_78,2);
      if (__fd == -1) {
        uVar1 = dev->pin;
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        syslog(3,"gpio%i: edge_mode: Failed to open \'edge\' for writing: %s",(ulong)uVar1,pcVar5);
        mVar2 = MRAA_ERROR_INVALID_RESOURCE;
      }
      else {
        if (mode < 4) {
          mVar2 = (*(code *)(&DAT_00124a18 + *(int *)(&DAT_00124a18 + (ulong)mode * 4)))();
          return mVar2;
        }
        close(__fd);
        mVar2 = MRAA_ERROR_FEATURE_NOT_IMPLEMENTED;
      }
    }
  }
  return mVar2;
}

Assistant:

mraa_result_t
mraa_gpio_edge_mode(mraa_gpio_context dev, mraa_gpio_edge_t mode)
{
    if (dev == NULL) {
        syslog(LOG_ERR, "gpio: edge_mode: context is invalid");
        return MRAA_ERROR_INVALID_HANDLE;
    }

    if (IS_FUNC_DEFINED(dev, gpio_edge_mode_replace))
        return dev->advance_func->gpio_edge_mode_replace(dev, mode);

    /* Initialize events array. */
    if (dev->events == NULL && mode != MRAA_GPIO_EDGE_NONE) {
        dev->events = malloc(dev->num_pins * sizeof(mraa_gpio_event));
        if (dev->events == NULL) {
            syslog(LOG_ERR, "mraa_gpio_edge_mode() malloc error");
            return MRAA_ERROR_NO_RESOURCES;
        }

        for (int i = 0; i < dev->num_pins; ++i) {
            dev->events[i].id = -1;
        }
    }

    if (plat->chardev_capable)
        return mraa_gpio_chardev_edge_mode(dev, mode);

    mraa_gpio_context it = dev;

    while (it) {

        if (it->value_fp != -1) {
            close(it->value_fp);
            it->value_fp = -1;
        }

        char filepath[MAX_SIZE];
        snprintf(filepath, MAX_SIZE, SYSFS_CLASS_GPIO "/gpio%d/edge", it->pin);

        int edge = open(filepath, O_RDWR);
        if (edge == -1) {
            syslog(LOG_ERR, "gpio%i: edge_mode: Failed to open 'edge' for writing: %s", it->pin,
                   strerror(errno));
            return MRAA_ERROR_INVALID_RESOURCE;
        }

        char bu[MAX_SIZE];
        int length;
        switch (mode) {
            case MRAA_GPIO_EDGE_NONE:
                length = snprintf(bu, sizeof(bu), "none");
                break;
            case MRAA_GPIO_EDGE_BOTH:
                length = snprintf(bu, sizeof(bu), "both");
                break;
            case MRAA_GPIO_EDGE_RISING:
                length = snprintf(bu, sizeof(bu), "rising");
                break;
            case MRAA_GPIO_EDGE_FALLING:
                length = snprintf(bu, sizeof(bu), "falling");
                break;
            default:
                close(edge);
                return MRAA_ERROR_FEATURE_NOT_IMPLEMENTED;
        }
        if (write(edge, bu, length * sizeof(char)) == -1) {
            syslog(LOG_ERR, "gpio%i: edge_mode: Failed to write to 'edge': %s", it->pin, strerror(errno));
            close(edge);
            return MRAA_ERROR_UNSPECIFIED;
        }

        close(edge);

        it = it->next;
    }

    return MRAA_SUCCESS;
}